

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caniter.cpp
# Opt level: O0

void __thiscall icu_63::CanonicalIterator::cleanPieces(CanonicalIterator *this)

{
  UnicodeString *pUVar1;
  UnicodeString *this_00;
  void *in_RSI;
  int local_14;
  int32_t i;
  CanonicalIterator *this_local;
  
  if (this->pieces != (UnicodeString **)0x0) {
    for (local_14 = 0; local_14 < this->pieces_length; local_14 = local_14 + 1) {
      if ((this->pieces[local_14] != (UnicodeString *)0x0) &&
         (pUVar1 = this->pieces[local_14], pUVar1 != (UnicodeString *)0x0)) {
        this_00 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
        while (pUVar1 != this_00) {
          this_00 = this_00 + -1;
          UnicodeString::~UnicodeString(this_00);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
      }
    }
    uprv_free_63(this->pieces);
    this->pieces = (UnicodeString **)0x0;
    this->pieces_length = 0;
  }
  if (this->pieces_lengths != (int32_t *)0x0) {
    uprv_free_63(this->pieces_lengths);
    this->pieces_lengths = (int32_t *)0x0;
  }
  if (this->current != (int32_t *)0x0) {
    uprv_free_63(this->current);
    this->current = (int32_t *)0x0;
    this->current_length = 0;
  }
  return;
}

Assistant:

void CanonicalIterator::cleanPieces() {
    int32_t i = 0;
    if(pieces != NULL) {
        for(i = 0; i < pieces_length; i++) {
            if(pieces[i] != NULL) {
                delete[] pieces[i];
            }
        }
        uprv_free(pieces);
        pieces = NULL;
        pieces_length = 0;
    }
    if(pieces_lengths != NULL) {
        uprv_free(pieces_lengths);
        pieces_lengths = NULL;
    }
    if(current != NULL) {
        uprv_free(current);
        current = NULL;
        current_length = 0;
    }
}